

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveModel(FastText *this,string *filename)

{
  bool *pbVar1;
  char cVar2;
  invalid_argument *this_00;
  FastText *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_238;
  ofstream ofs;
  FastText local_1a8 [2];
  
  std::ofstream::ofstream(&ofs,(string *)filename,_S_bin);
  this_01 = local_1a8;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    signModel(this_01,(ostream *)&ofs);
    Args::save((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (ostream *)&ofs);
    Dictionary::save((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (ostream *)&ofs);
    pbVar1 = &this->quant_;
    std::ostream::write((char *)&ofs,(long)pbVar1);
    if (*pbVar1 == true) {
      QMatrix::save((this->qinput_).
                    super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ostream *)&ofs);
    }
    else {
      Matrix::save((this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ostream *)&ofs);
    }
    std::ostream::write((char *)&ofs,
                        (long)&((this->args_).
                                super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->qout);
    if ((*pbVar1 == true) &&
       (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout
        == true)) {
      QMatrix::save((this->qoutput_).
                    super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (ostream *)&ofs);
    }
    else {
      Matrix::save((this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(ostream *)&ofs);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&ofs);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_238,filename," cannot be opened for saving!");
  std::invalid_argument::invalid_argument(this_00,(string *)&bStack_238);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::saveModel(const std::string& filename) {
	std::ofstream ofs(filename, std::ofstream::binary);
	if (!ofs.is_open()) {
		throw std::invalid_argument(filename + " cannot be opened for saving!");
	}
	signModel(ofs);
	args_->save(ofs);
	dict_->save(ofs);

	ofs.write((char*)&(quant_), sizeof(bool));
	if (quant_) {
		qinput_->save(ofs);
	} else {
		input_->save(ofs);
	}

	ofs.write((char*)&(args_->qout), sizeof(bool));
	if (quant_ && args_->qout) {
		qoutput_->save(ofs);
	} else {
		output_->save(ofs);
	}

	ofs.close();
}